

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,int genIndex)

{
  iterator iVar1;
  ulong uVar2;
  _Elt_pointer pSVar3;
  HelicsException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  string_view message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  key_type local_30;
  
  local_30._M_str = key._M_str;
  local_30._M_len = key._M_len;
  iVar1 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_30);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,local_30._M_str,local_30._M_str + local_30._M_len);
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_70," was not recognized as a valid publication");
    local_50 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar5) {
      local_40 = paVar5->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar5->_M_allocated_capacity;
    }
    local_48 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    message._M_str = (char *)local_50;
    message._M_len = local_48;
    HelicsException::HelicsException(this_00,message);
    *(undefined ***)this_00 = &PTR__HelicsException_00512398;
    __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  pSVar3 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar2 = ((long)pSVar3 -
           (long)(this->sources).
                 super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 8) +
          (long)*(int *)&iVar1._M_node[1]._M_left;
  if ((long)uVar2 < 0) {
    uVar6 = (long)uVar2 >> 1;
  }
  else {
    if (uVar2 < 2) {
      pSVar3 = pSVar3 + *(int *)&iVar1._M_node[1]._M_left;
      goto LAB_001dc8a6;
    }
    uVar6 = uVar2 >> 1;
  }
  pSVar3 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar2 + uVar6 * -2;
LAB_001dc8a6:
  pSVar3->generatorIndex = genIndex;
  return;
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, int genIndex)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        sources[fnd->second].generatorIndex = genIndex;
    }